

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesPartialsFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  iVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
  iVar7 = startPattern * 4;
  uVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  for (uVar6 = 0; uVar6 != (~((int)uVar3 >> 0x1f) & uVar3); uVar6 = uVar6 + 1) {
    iVar5 = (int)uVar6 * 0x14;
    lVar9 = (long)iVar7 + 3;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = matrices2[uVar6 * 0x14];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = matrices2[uVar6 * 0x14 + 1];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = matrices2[uVar6 * 0x14 + 2];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = matrices2[uVar6 * 0x14 + 3];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = matrices2[uVar6 * 0x14 + 5];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = matrices2[uVar6 * 0x14 + 6];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = matrices2[uVar6 * 0x14 + 7];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = matrices2[uVar6 * 0x14 + 8];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = matrices2[uVar6 * 0x14 + 10];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = matrices2[uVar6 * 0x14 + 0xb];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = matrices2[uVar6 * 0x14 + 0xc];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = matrices2[uVar6 * 0x14 + 0xd];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = matrices2[uVar6 * 0x14 + 0xf];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = matrices2[uVar6 * 0x14 + 0x10];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = matrices2[uVar6 * 0x14 + 0x11];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = matrices2[uVar6 * 0x14 + 0x12];
    lVar8 = (long)startPattern;
    while (lVar8 < endPattern) {
      iVar4 = states1[lVar8];
      dVar1 = scaleFactors[lVar8];
      lVar8 = lVar8 + 1;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = partials2[lVar9 + -2];
      auVar10 = vmulsd_avx512f(auVar18,auVar34);
      auVar11 = vmulsd_avx512f(auVar22,auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = partials2[lVar9 + -2];
      auVar12 = vmulsd_avx512f(auVar26,auVar35);
      auVar13 = vmulsd_avx512f(auVar30,auVar35);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = partials2[lVar9 + -3];
      auVar10 = vfmadd231sd_avx512f(auVar10,auVar17,auVar15);
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar21,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = partials2[lVar9 + -3];
      auVar12 = vfmadd231sd_avx512f(auVar12,auVar25,auVar16);
      auVar13 = vfmadd231sd_avx512f(auVar13,auVar29,auVar16);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = partials2[lVar9 + -1];
      auVar10 = vfmadd231sd_avx512f(auVar10,auVar19,auVar36);
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar23,auVar36);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = partials2[lVar9 + -1];
      auVar12 = vfmadd231sd_avx512f(auVar12,auVar27,auVar37);
      auVar13 = vfmadd231sd_avx512f(auVar13,auVar31,auVar37);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = partials2[lVar9];
      auVar14 = vfmadd231sd_avx512f(auVar10,auVar20,auVar38);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = matrices1[iVar4 + iVar5];
      auVar10 = vmulsd_avx512f(auVar14,auVar10);
      auVar14 = vfmadd231sd_avx512f(auVar11,auVar24,auVar38);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = partials2[lVar9];
      auVar15 = vfmadd231sd_avx512f(auVar12,auVar28,auVar39);
      auVar16 = vfmadd231sd_avx512f(auVar13,auVar32,auVar39);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar1;
      auVar10 = vdivsd_avx512f(auVar10,auVar33);
      vmovsd_avx512f(auVar10);
      destP[lVar9 + -3] = destP[lVar9 + -3];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = matrices1[iVar4 + iVar5 + 5];
      auVar10 = vmulsd_avx512f(auVar14,auVar11);
      auVar10 = vdivsd_avx512f(auVar10,auVar33);
      vmovsd_avx512f(auVar10);
      destP[lVar9 + -2] = destP[lVar9 + -2];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = matrices1[iVar4 + iVar5 + 10];
      auVar10 = vmulsd_avx512f(auVar15,auVar12);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar1;
      auVar10 = vdivsd_avx512f(auVar10,auVar14);
      vmovsd_avx512f(auVar10);
      destP[lVar9 + -1] = destP[lVar9 + -1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = matrices1[iVar4 + iVar5 + 0xf];
      auVar10 = vmulsd_avx512f(auVar16,auVar13);
      auVar10 = vdivsd_avx512f(auVar10,auVar14);
      vmovsd_avx512f(auVar10);
      destP[lVar9] = destP[lVar9];
      lVar9 = lVar9 + 4;
    }
    iVar7 = iVar7 + iVar2 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesPartialsFixedScaling(REALTYPE* destP,
                                                                             const int* states1,
                                                                             const REALTYPE* matrices1,
                                                                             const REALTYPE* partials2,
                                                                             const REALTYPE* matrices2,
                                                                             const REALTYPE* scaleFactors,
                                                                             int startPattern,
                                                                             int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            destP[u    ] = matrices1[w            + state1] * sum20 / scaleFactor;
            destP[u + 1] = matrices1[w + OFFSET*1 + state1] * sum21 / scaleFactor;
            destP[u + 2] = matrices1[w + OFFSET*2 + state1] * sum22 / scaleFactor;
            destP[u + 3] = matrices1[w + OFFSET*3 + state1] * sum23 / scaleFactor;

            u += 4;
        }
    }
}